

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O0

void __thiscall
denialofservice_tests::OutboundTest::AddRandomOutboundPeer
          (OutboundTest *this,NodeId *id,vector<CNode_*,_std::allocator<CNode_*>_> *vNodes,
          PeerManager *peerLogic,ConnmanTestMsg *connman,ConnectionType connType,bool onion_peer)

{
  long lVar1;
  Span<const_unsigned_char> addr_00;
  bool bVar2;
  void *pvVar3;
  reference ppCVar4;
  long in_RCX;
  long *in_RSI;
  uchar *in_RDI;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  CNode *node;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tor_addr;
  CAddress addr;
  CAddress *in_stack_fffffffffffffd28;
  CAddress *this_00;
  CAddress *in_stack_fffffffffffffd30;
  CNode *this_01;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 uVar5;
  int in_stack_fffffffffffffd44;
  CAddress *in_stack_fffffffffffffd48;
  vector<CNode_*,_std::allocator<CNode_*>_> *this_02;
  CService *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  allocator<char> *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  allocator<char> *__s;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  size_t in_stack_fffffffffffffdb8;
  value_type pCVar6;
  allocator<char> local_1f9 [17];
  void *local_1e8;
  const_string local_1e0;
  assertion_result local_190 [3];
  undefined1 in_stack_fffffffffffffeff;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  shared_ptr<Sock> *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  CNode *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::CAddress(in_stack_fffffffffffffd48);
  if ((in_stack_00000008 & 1) != 0) {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (pointer)in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd68,
                 (const_string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (const_string *)in_stack_fffffffffffffd50);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd30,
                 in_stack_fffffffffffffd28);
      addr_00.m_size = in_stack_fffffffffffffdb8;
      addr_00.m_data = in_RDI;
      OnionToString_abi_cxx11_(addr_00);
      CNetAddr::SetSpecial
                (&in_stack_fffffffffffffd50->super_CNetAddr,(string *)in_stack_fffffffffffffd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 SUB81((ulong)in_stack_fffffffffffffd30 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (pointer)in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffd30,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (pointer)in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd28 = (CAddress *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_190,(lazy_ostream *)&stack0xfffffffffffffe40,&local_1e0,0x74,REQUIRE,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd28);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  while (bVar2 = CNetAddr::IsRoutable
                           ((CNetAddr *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    RandomMixin<FastRandomContext>::randbits
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd44
              );
    ip(in_stack_fffffffffffffd5c);
    CAddress::CAddress((CAddress *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                       in_stack_fffffffffffffd50,(ServiceFlags)in_stack_fffffffffffffd48);
    CAddress::operator=((CAddress *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                        in_stack_fffffffffffffd30);
    CAddress::~CAddress(in_stack_fffffffffffffd28);
    CService::~CService(&in_stack_fffffffffffffd28->super_CService);
  }
  pvVar3 = operator_new(0x3a8);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RSI;
  *in_RSI = (long)((long)&(this_03->_M_dataplus)._M_p + 1);
  std::shared_ptr<Sock>::shared_ptr
            ((shared_ptr<Sock> *)in_stack_fffffffffffffd28,(nullptr_t)0x5c55ef);
  CAddress::CAddress(in_stack_fffffffffffffd48);
  __s = local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)__s,in_stack_fffffffffffffd68);
  std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>::
  unique_ptr<std::default_delete<i2p::sam::Session>,void>
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             in_stack_fffffffffffffd28,(nullptr_t)0x5c5657);
  this_02 = (vector<CNode_*,_std::allocator<CNode_*>_> *)&stack0xfffffffffffffec0;
  this_01 = (CNode *)&stack0xfffffffffffffee8;
  this_00 = (CAddress *)&stack0xffffffffffffff08;
  uVar5 = 0;
  CNode::CNode(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (CAddress *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (uint64_t)in_stack_ffffffffffffff00._M_pi,(CAddress *)in_stack_ffffffffffffff80,
               (string *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
               (bool)in_stack_fffffffffffffeff,(CNodeOptions *)in_stack_ffffffffffffffa0);
  local_1e8 = pvVar3;
  std::vector<CNode*,std::allocator<CNode*>>::emplace_back<CNode*>
            (this_02,(CNode **)CONCAT44(in_stack_fffffffffffffd44,uVar5));
  CNodeOptions::~CNodeOptions((CNodeOptions *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_1f9);
  CAddress::~CAddress(this_00);
  std::shared_ptr<Sock>::~shared_ptr((shared_ptr<Sock> *)this_00);
  ppCVar4 = std::vector<CNode_*,_std::allocator<CNode_*>_>::back
                      ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00);
  pCVar6 = *ppCVar4;
  CNode::SetCommonVersion(this_01,(int)((ulong)this_00 >> 0x20));
  (*(code *)**(undefined8 **)(in_RCX + 8))(in_RCX + 8,pCVar6,9);
  std::atomic<bool>::operator=((atomic<bool> *)this_00,false);
  ConnmanTestMsg::AddTestNode
            ((ConnmanTestMsg *)CONCAT44(in_R9D,in_stack_fffffffffffffd60),
             (CNode *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  CAddress::~CAddress(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddRandomOutboundPeer(NodeId& id, std::vector<CNode*>& vNodes, PeerManager& peerLogic, ConnmanTestMsg& connman, ConnectionType connType, bool onion_peer = false)
{
    CAddress addr;

    if (onion_peer) {
        auto tor_addr{m_rng.randbytes(ADDR_TORV3_SIZE)};
        BOOST_REQUIRE(addr.SetSpecial(OnionToString(tor_addr)));
    }

    while (!addr.IsRoutable()) {
        addr = CAddress(ip(m_rng.randbits(32)), NODE_NONE);
    }

    vNodes.emplace_back(new CNode{id++,
                                  /*sock=*/nullptr,
                                  addr,
                                  /*nKeyedNetGroupIn=*/0,
                                  /*nLocalHostNonceIn=*/0,
                                  CAddress(),
                                  /*addrNameIn=*/"",
                                  connType,
                                  /*inbound_onion=*/false});
    CNode &node = *vNodes.back();
    node.SetCommonVersion(PROTOCOL_VERSION);

    peerLogic.InitializeNode(node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node.fSuccessfullyConnected = true;

    connman.AddTestNode(node);
}